

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * soul::Value::createFloatVectorArray(ChannelArrayView<float> data)

{
  long lVar1;
  int line;
  long lVar2;
  char *location;
  Value *in_RDI;
  char *message;
  ulong uVar3;
  float *pfVar4;
  long in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  PrimitiveType local_7c;
  InterleavedView<float> local_78;
  Type local_60;
  Type local_48;
  
  local_7c.type = float32;
  Type::createVector(&local_60,&local_7c,(ulong)in_stack_00000018);
  Type::createArray(&local_48,&local_60,(ulong)in_stack_0000001c);
  Value(in_RDI,&local_48);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_60.structure.object);
  getData((PackedData *)&local_60,in_RDI);
  PackedData::getAsChannelSet32(&local_78,(PackedData *)&local_60);
  line = 0x2e1;
  location = "copy";
  message = "size == dest.getSize()";
  if (in_stack_00000018 == local_78.size.numChannels) {
    if (in_stack_0000001c == local_78.size.numFrames) {
      if (in_stack_00000018 != 0) {
        uVar3 = 0;
        location = "getIterator";
        message = "channel < size.numChannels";
        do {
          line = 0xbb;
          if ((uVar3 == in_stack_00000018) || (uVar3 == local_78.size.numChannels))
          goto LAB_001a3233;
          if (in_stack_0000001c != 0) {
            lVar1 = *(long *)(in_stack_00000008 + uVar3 * 8);
            lVar2 = 0;
            pfVar4 = local_78.data.data;
            do {
              *pfVar4 = *(float *)(lVar1 + (ulong)in_stack_00000010 * 4 + lVar2 * 4);
              lVar2 = lVar2 + 1;
              pfVar4 = pfVar4 + local_78.data.stride;
            } while (in_stack_0000001c != (uint)lVar2);
          }
          uVar3 = uVar3 + 1;
          local_78.data.data = local_78.data.data + 1;
        } while (uVar3 != in_stack_00000018);
      }
      return in_RDI;
    }
  }
LAB_001a3233:
  throwInternalCompilerError(message,location,line);
}

Assistant:

Value Value::createFloatVectorArray (choc::buffer::ChannelArrayView<float> data)
{
    Value v (Type::createVector (PrimitiveType::float32, data.getNumChannels()).createArray (data.getNumFrames()));
    copy (v.getAsChannelSet32(), data);
    return v;
}